

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeDualActivity
          (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *dual,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *activity,bool unscaled)

{
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar12;
  Item *pIVar13;
  cpp_dec_float<100U,_int,_void> *pcVar14;
  undefined8 *puVar15;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  long lVar16;
  long lVar17;
  int n;
  cpp_dec_float<100U,_int,_void> *pcVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  cpp_dec_float<100U,_int,_void> *pcVar22;
  type t;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp;
  cpp_dec_float<100U,_int,_void> local_a8;
  long local_58;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_50;
  
  if ((this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum !=
      (int)((ulong)((long)(dual->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(dual->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333) {
    puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_a8.data._M_elems._0_8_ = local_a8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,
               "XSPXLP02 Dual vector for computing dual activity has wrong dimension","");
    *puVar15 = &PTR__SPxException_006a9ee8;
    puVar15[1] = puVar15 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar15 + 1),local_a8.data._M_elems._0_8_,
               local_a8.data._M_elems._0_8_ + local_a8.data._M_elems._8_8_);
    *puVar15 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  if ((this->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum !=
      (int)((ulong)((long)(activity->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(activity->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333) {
    puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_a8.data._M_elems._0_8_ = local_a8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,
               "XSPXLP04 Activity vector computing dual activity has wrong dimension","");
    *puVar15 = &PTR__SPxException_006a9ee8;
    puVar15[1] = puVar15 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar15 + 1),local_a8.data._M_elems._0_8_,
               local_a8.data._M_elems._0_8_ + local_a8.data._M_elems._8_8_);
    *puVar15 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  if ((this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum < 1) {
    uVar19 = 0;
  }
  else {
    lVar20 = 0;
    uVar19 = 0;
    do {
      pnVar12 = (dual->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar20 + 8U) == 2) break;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_a8,0,(type *)0x0);
      iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         ((cpp_dec_float<100U,_int,_void> *)
                          ((long)(pnVar12->m_backend).data._M_elems + lVar20),&local_a8);
      if (iVar11 != 0) break;
      uVar19 = uVar19 + 1;
      lVar20 = lVar20 + 0x50;
    } while ((long)uVar19 <
             (long)(this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
  }
  if ((int)uVar19 <
      (this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum) {
    iVar11 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    local_50.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x0;
    local_50.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memsize = 0;
    local_50.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    local_50._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b0b50;
    local_50.theelem =
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    n = 2;
    if (0 < iVar11) {
      n = iVar11;
    }
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::allocMem(&local_50,n);
    uVar21 = uVar19 & 0xffffffff;
    if ((unscaled) && (this->_isScaled == true)) {
      (*this->lp_scaler->_vptr_SPxScaler[0x1a])(this->lp_scaler,this,uVar19 & 0xffffffff,&local_50);
      pnVar2 = (activity->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar12 = (activity->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pnVar12 != pnVar2;
          pnVar12 = pnVar12 + 1) {
        (pnVar12->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar12->m_backend).prec_elem = 0x10;
        (pnVar12->m_backend).data._M_elems[0] = 0;
        (pnVar12->m_backend).data._M_elems[1] = 0;
        (pnVar12->m_backend).data._M_elems[2] = 0;
        (pnVar12->m_backend).data._M_elems[3] = 0;
        (pnVar12->m_backend).data._M_elems[4] = 0;
        (pnVar12->m_backend).data._M_elems[5] = 0;
        (pnVar12->m_backend).data._M_elems[6] = 0;
        (pnVar12->m_backend).data._M_elems[7] = 0;
        (pnVar12->m_backend).data._M_elems[8] = 0;
        (pnVar12->m_backend).data._M_elems[9] = 0;
        (pnVar12->m_backend).data._M_elems[10] = 0;
        (pnVar12->m_backend).data._M_elems[0xb] = 0;
        (pnVar12->m_backend).data._M_elems[0xc] = 0;
        (pnVar12->m_backend).data._M_elems[0xd] = 0;
        (pnVar12->m_backend).data._M_elems[0xe] = 0;
        (pnVar12->m_backend).data._M_elems[0xf] = 0;
        *(undefined8 *)((long)(pnVar12->m_backend).data._M_elems + 0x3d) = 0;
      }
      if (0 < (long)local_50.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
        lVar20 = 0;
        do {
          iVar11 = *(int *)((long)(&(local_50.
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar20);
          pnVar12 = (activity->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar15 = (undefined8 *)
                    ((long)((local_50.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar20);
          uVar3 = *puVar15;
          uVar5 = puVar15[1];
          puVar15 = (undefined8 *)
                    ((long)((local_50.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar20 + 0x10);
          uVar6 = *puVar15;
          uVar7 = puVar15[1];
          puVar15 = (undefined8 *)
                    ((long)((local_50.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar20 + 0x20);
          uVar8 = *puVar15;
          uVar9 = puVar15[1];
          puVar15 = (undefined8 *)
                    ((long)((local_50.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar20 + 0x30);
          uVar10 = puVar15[1];
          puVar1 = pnVar12[iVar11].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar1 = *puVar15;
          *(undefined8 *)(puVar1 + 2) = uVar10;
          puVar1 = pnVar12[iVar11].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar1 = uVar8;
          *(undefined8 *)(puVar1 + 2) = uVar9;
          puVar1 = pnVar12[iVar11].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = uVar6;
          *(undefined8 *)(puVar1 + 2) = uVar7;
          *(undefined8 *)&pnVar12[iVar11].m_backend.data = uVar3;
          *(undefined8 *)(pnVar12[iVar11].m_backend.data._M_elems + 2) = uVar5;
          pnVar12[iVar11].m_backend.exp =
               *(int *)((long)(&((local_50.
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val).m_backend.data + 1) + lVar20);
          pnVar12[iVar11].m_backend.neg =
               *(bool *)((long)(&((local_50.
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .m_elem)->val).m_backend.data + 1) + lVar20 + 4);
          uVar3 = *(undefined8 *)
                   ((long)(&((local_50.
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .m_elem)->val).m_backend.data + 1) + lVar20 + 8);
          pnVar12[iVar11].m_backend.fpclass = (int)uVar3;
          pnVar12[iVar11].m_backend.prec_elem = (int)((ulong)uVar3 >> 0x20);
          lVar20 = lVar20 + 0x54;
        } while ((long)local_50.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused * 0x54 - lVar20 != 0);
      }
    }
    else {
      pIVar13 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[uVar21].idx;
      pnVar2 = (activity->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar12 = (activity->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pnVar12 != pnVar2;
          pnVar12 = pnVar12 + 1) {
        (pnVar12->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar12->m_backend).prec_elem = 0x10;
        (pnVar12->m_backend).data._M_elems[0] = 0;
        (pnVar12->m_backend).data._M_elems[1] = 0;
        (pnVar12->m_backend).data._M_elems[2] = 0;
        (pnVar12->m_backend).data._M_elems[3] = 0;
        (pnVar12->m_backend).data._M_elems[4] = 0;
        (pnVar12->m_backend).data._M_elems[5] = 0;
        (pnVar12->m_backend).data._M_elems[6] = 0;
        (pnVar12->m_backend).data._M_elems[7] = 0;
        (pnVar12->m_backend).data._M_elems[8] = 0;
        (pnVar12->m_backend).data._M_elems[9] = 0;
        (pnVar12->m_backend).data._M_elems[10] = 0;
        (pnVar12->m_backend).data._M_elems[0xb] = 0;
        (pnVar12->m_backend).data._M_elems[0xc] = 0;
        (pnVar12->m_backend).data._M_elems[0xd] = 0;
        (pnVar12->m_backend).data._M_elems[0xe] = 0;
        (pnVar12->m_backend).data._M_elems[0xf] = 0;
        *(undefined8 *)((long)(pnVar12->m_backend).data._M_elems + 0x3d) = 0;
      }
      if (0 < (pIVar13->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar20 = 0x50;
        lVar16 = 0;
        do {
          pNVar4 = (pIVar13->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          iVar11 = *(int *)((long)(pNVar4->val).m_backend.data._M_elems + lVar20);
          pnVar12 = (activity->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar15 = (undefined8 *)((long)(&pNVar4->val + -1) + lVar20);
          uVar3 = *puVar15;
          uVar5 = puVar15[1];
          puVar15 = (undefined8 *)((long)(&(pNVar4->val).m_backend.data + -1) + lVar20);
          uVar6 = *puVar15;
          uVar7 = puVar15[1];
          puVar15 = (undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar20 + -0x30);
          uVar8 = *puVar15;
          uVar9 = puVar15[1];
          puVar15 = (undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar20 + -0x20);
          uVar10 = puVar15[1];
          puVar1 = pnVar12[iVar11].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar1 = *puVar15;
          *(undefined8 *)(puVar1 + 2) = uVar10;
          puVar1 = pnVar12[iVar11].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar1 = uVar8;
          *(undefined8 *)(puVar1 + 2) = uVar9;
          puVar1 = pnVar12[iVar11].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = uVar6;
          *(undefined8 *)(puVar1 + 2) = uVar7;
          *(undefined8 *)&pnVar12[iVar11].m_backend.data = uVar3;
          *(undefined8 *)(pnVar12[iVar11].m_backend.data._M_elems + 2) = uVar5;
          pnVar12[iVar11].m_backend.exp =
               *(int *)((long)(pNVar4->val).m_backend.data._M_elems + lVar20 + -0x10);
          pnVar12[iVar11].m_backend.neg =
               *(bool *)((long)(pNVar4->val).m_backend.data._M_elems + lVar20 + -0xc);
          uVar3 = *(undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar20 + -8);
          pnVar12[iVar11].m_backend.fpclass = (int)uVar3;
          pnVar12[iVar11].m_backend.prec_elem = (int)((ulong)uVar3 >> 0x20);
          lVar16 = lVar16 + 1;
          lVar20 = lVar20 + 0x54;
        } while (lVar16 < (pIVar13->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
    }
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)activity,
                 (dual->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar21);
    if ((int)uVar19 + 1 <
        (this->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum) {
      lVar20 = uVar21 + 1;
      do {
        pnVar12 = (dual->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_58 = lVar20;
        if (pnVar12[lVar20].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0038676c:
          if ((unscaled) && (this->_isScaled == true)) {
            (*this->lp_scaler->_vptr_SPxScaler[0x1a])(this->lp_scaler,this,local_58,&local_50);
            lVar16 = (long)local_50.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
            if (0 < lVar16) {
              pcVar22 = &(dual->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend;
              lVar17 = lVar16 + 1;
              lVar20 = lVar16 * 0x54;
              do {
                pcVar14 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)local_50.
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[-1].val.m_backend.data._M_elems + lVar20);
                local_a8.fpclass = cpp_dec_float_finite;
                local_a8.prec_elem = 0x10;
                local_a8.data._M_elems[0] = 0;
                local_a8.data._M_elems[1] = 0;
                local_a8.data._M_elems[2] = 0;
                local_a8.data._M_elems[3] = 0;
                local_a8.data._M_elems[4] = 0;
                local_a8.data._M_elems[5] = 0;
                local_a8.data._M_elems[6] = 0;
                local_a8.data._M_elems[7] = 0;
                local_a8.data._M_elems[8] = 0;
                local_a8.data._M_elems[9] = 0;
                local_a8.data._M_elems[10] = 0;
                local_a8.data._M_elems[0xb] = 0;
                local_a8.data._M_elems[0xc] = 0;
                local_a8.data._M_elems[0xd] = 0;
                local_a8.data._M_elems._56_5_ = 0;
                local_a8.data._M_elems[0xf]._1_3_ = 0;
                local_a8.exp = 0;
                local_a8.neg = false;
                pcVar18 = pcVar22;
                if ((pcVar14 != &local_a8) && (pcVar18 = pcVar14, &local_a8 != pcVar22)) {
                  local_a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar22->data)._M_elems;
                  local_a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar22->data)._M_elems + 2);
                  local_a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar22->data)._M_elems + 4);
                  local_a8.data._M_elems._24_8_ = *(undefined8 *)((pcVar22->data)._M_elems + 6);
                  local_a8.data._M_elems._32_8_ = *(undefined8 *)((pcVar22->data)._M_elems + 8);
                  local_a8.data._M_elems._40_8_ = *(undefined8 *)((pcVar22->data)._M_elems + 10);
                  local_a8.data._M_elems._48_8_ = *(undefined8 *)((pcVar22->data)._M_elems + 0xc);
                  uVar3 = *(undefined8 *)((pcVar22->data)._M_elems + 0xe);
                  local_a8.data._M_elems._56_5_ = SUB85(uVar3,0);
                  local_a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_a8.exp = pcVar22->exp;
                  local_a8.neg = pcVar22->neg;
                  local_a8.fpclass = pcVar22->fpclass;
                  local_a8.prec_elem = pcVar22->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                          (&local_a8,pcVar18);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (&(activity->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)((long)(&local_50.
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar20)].m_backend,&local_a8);
                lVar17 = lVar17 + -1;
                lVar20 = lVar20 + -0x54;
              } while (1 < lVar17);
            }
          }
          else {
            pIVar13 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.theitem;
            iVar11 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[local_58].idx;
            lVar16 = (long)pIVar13[iVar11].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
            if (0 < lVar16) {
              pcVar22 = &(dual->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend;
              pIVar13 = pIVar13 + iVar11;
              lVar17 = lVar16 + 1;
              lVar20 = lVar16 * 0x54;
              do {
                pcVar14 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(pIVar13->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[-1].val.m_backend.data._M_elems + lVar20);
                local_a8.fpclass = cpp_dec_float_finite;
                local_a8.prec_elem = 0x10;
                local_a8.data._M_elems[0] = 0;
                local_a8.data._M_elems[1] = 0;
                local_a8.data._M_elems[2] = 0;
                local_a8.data._M_elems[3] = 0;
                local_a8.data._M_elems[4] = 0;
                local_a8.data._M_elems[5] = 0;
                local_a8.data._M_elems[6] = 0;
                local_a8.data._M_elems[7] = 0;
                local_a8.data._M_elems[8] = 0;
                local_a8.data._M_elems[9] = 0;
                local_a8.data._M_elems[10] = 0;
                local_a8.data._M_elems[0xb] = 0;
                local_a8.data._M_elems[0xc] = 0;
                local_a8.data._M_elems[0xd] = 0;
                local_a8.data._M_elems._56_5_ = 0;
                local_a8.data._M_elems[0xf]._1_3_ = 0;
                local_a8.exp = 0;
                local_a8.neg = false;
                pcVar18 = pcVar22;
                if ((pcVar14 != &local_a8) && (pcVar18 = pcVar14, &local_a8 != pcVar22)) {
                  local_a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar22->data)._M_elems;
                  local_a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar22->data)._M_elems + 2);
                  local_a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar22->data)._M_elems + 4);
                  local_a8.data._M_elems._24_8_ = *(undefined8 *)((pcVar22->data)._M_elems + 6);
                  local_a8.data._M_elems._32_8_ = *(undefined8 *)((pcVar22->data)._M_elems + 8);
                  local_a8.data._M_elems._40_8_ = *(undefined8 *)((pcVar22->data)._M_elems + 10);
                  local_a8.data._M_elems._48_8_ = *(undefined8 *)((pcVar22->data)._M_elems + 0xc);
                  uVar3 = *(undefined8 *)((pcVar22->data)._M_elems + 0xe);
                  local_a8.data._M_elems._56_5_ = SUB85(uVar3,0);
                  local_a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_a8.exp = pcVar22->exp;
                  local_a8.neg = pcVar22->neg;
                  local_a8.fpclass = pcVar22->fpclass;
                  local_a8.prec_elem = pcVar22->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                          (&local_a8,pcVar18);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (&(activity->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)((long)(&(pIVar13->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar20)].m_backend,&local_a8);
                lVar17 = lVar17 + -1;
                lVar20 = lVar20 + -0x54;
              } while (1 < lVar17);
            }
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                    (&local_a8,0,(type *)0x0);
          iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&pnVar12[lVar20].m_backend,&local_a8);
          if (iVar11 != 0) goto LAB_0038676c;
        }
        lVar20 = local_58 + 1;
      } while ((int)lVar20 <
               (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
    }
    local_50._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b0b50;
    if (local_50.theelem !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_50.theelem);
    }
  }
  else {
    pnVar2 = (activity->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pnVar12 = (activity->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pnVar12 != pnVar2;
        pnVar12 = pnVar12 + 1) {
      (pnVar12->m_backend).fpclass = cpp_dec_float_finite;
      (pnVar12->m_backend).prec_elem = 0x10;
      (pnVar12->m_backend).data._M_elems[0] = 0;
      (pnVar12->m_backend).data._M_elems[1] = 0;
      (pnVar12->m_backend).data._M_elems[2] = 0;
      (pnVar12->m_backend).data._M_elems[3] = 0;
      (pnVar12->m_backend).data._M_elems[4] = 0;
      (pnVar12->m_backend).data._M_elems[5] = 0;
      (pnVar12->m_backend).data._M_elems[6] = 0;
      (pnVar12->m_backend).data._M_elems[7] = 0;
      (pnVar12->m_backend).data._M_elems[8] = 0;
      (pnVar12->m_backend).data._M_elems[9] = 0;
      (pnVar12->m_backend).data._M_elems[10] = 0;
      (pnVar12->m_backend).data._M_elems[0xb] = 0;
      (pnVar12->m_backend).data._M_elems[0xc] = 0;
      (pnVar12->m_backend).data._M_elems[0xd] = 0;
      (pnVar12->m_backend).data._M_elems[0xe] = 0;
      (pnVar12->m_backend).data._M_elems[0xf] = 0;
      *(undefined8 *)((long)(pnVar12->m_backend).data._M_elems + 0x3d) = 0;
    }
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::computeDualActivity(const VectorBase<R>& dual, VectorBase<R>& activity,
                                       const bool unscaled) const
{
   if(dual.dim() != nRows())
      throw SPxInternalCodeException("XSPXLP02 Dual vector for computing dual activity has wrong dimension");

   if(activity.dim() != nCols())
      throw SPxInternalCodeException("XSPXLP04 Activity vector computing dual activity has wrong dimension");

   int r;

   for(r = 0; r < nRows() && dual[r] == 0; r++)
      ;

   if(r >= nRows())
   {
      activity.clear();
      return;
   }

   DSVectorBase<R> tmp(nCols());

   if(unscaled && _isScaled)
   {
      lp_scaler->getRowUnscaled(*this, r, tmp);
      activity = tmp;
   }
   else
      activity = rowVector(r);

   activity *= dual[r];
   r++;

   for(; r < nRows(); r++)
   {
      if(dual[r] != 0)
      {
         if(unscaled && _isScaled)
         {
            lp_scaler->getRowUnscaled(*this, r, tmp);
            activity.multAdd(dual[r], tmp);
         }
         else
            activity.multAdd(dual[r], rowVector(r));
      }
   }
}